

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bro.cpp
# Opt level: O2

void __thiscall bro::args_t::args_t(args_t *this,int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  int *piVar5;
  char **ppcVar6;
  char *message;
  byte bVar7;
  byte *arg;
  int iVar8;
  long lVar9;
  
  this->force = false;
  this->verbose = false;
  this->decompress = false;
  this->no_copy_stat = false;
  this->input_file = (char *)0x0;
  this->output_file = (char *)0x0;
  *(undefined8 *)((long)&this->output_file + 4) = 0;
  *(undefined8 *)((long)&this->custom_dictionary + 4) = 0;
  this->repeat = 1;
  this->window = 0x16;
  this->fail = true;
  iVar8 = 1;
LAB_0010450f:
  if (iVar8 == argc) {
    if (this->quality < 100) {
      if (0xfffffff0 < this->window - 0x19U) {
        this->fail = false;
        return;
      }
      arg = (byte *)0x1081e1;
      message = "window out of range";
    }
    else {
      arg = (byte *)0x1081e1;
      message = "quality out of range";
    }
  }
  else {
    arg = (byte *)argv[iVar8];
    if (*arg == 0x2d) {
      bVar1 = arg[1];
      lVar9 = 0;
      bVar7 = 0;
LAB_00104546:
      if (lVar9 != 0xb0) {
        pbVar3 = *(byte **)((long)args_t::switches + lVar9);
        bVar2 = pbVar3[1];
        if (bVar2 == 0) {
          bVar7 = *pbVar3;
        }
        if ((*pbVar3 != bVar1) ||
           (iVar4 = strcmp((char *)(pbVar3 + 1),(char *)(arg + 2)), iVar4 != 0)) goto LAB_00104578;
        switch(bVar7) {
        case 100:
        case 0x75:
          this->decompress = true;
          break;
        case 0x66:
          this->force = true;
          break;
        case 0x69:
        case 0x6f:
          iVar8 = iVar8 + 1;
          if (iVar8 == argc) goto LAB_001046f5;
          ppcVar6 = &this->output_file;
          if (bVar7 == 0x69) {
            ppcVar6 = &this->input_file;
          }
          *ppcVar6 = argv[iVar8];
          break;
        case 0x71:
        case 0x72:
        case 0x77:
          iVar8 = iVar8 + 1;
          if (iVar8 == argc) {
LAB_001046f5:
            message = "too few arguments";
            goto LAB_001046cb;
          }
          piVar5 = &this->window;
          if (bVar7 == 0x72) {
            piVar5 = &this->repeat;
          }
          if (bVar7 == 0x71) {
            piVar5 = &this->quality;
          }
          *piVar5 = 0;
          arg = (byte *)argv[iVar8];
          iVar4 = 0;
          goto LAB_001045e2;
        case 0x76:
          this->verbose = true;
          break;
        default:
          if ((bVar7 == 0x4e) && (bVar2 != 0)) {
            this->no_copy_stat = true;
            break;
          }
        case 0x65:
        case 0x67:
        case 0x68:
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x6e:
        case 0x70:
        case 0x73:
        case 0x74:
          message = "unknown argument";
          goto LAB_001046cb;
        }
      }
      goto LAB_00104583;
    }
    message = "unexpected argument";
  }
LAB_001046cb:
  error(this,(char *)arg,message,args_t::switches);
  return;
LAB_001045e2:
  bVar1 = *arg;
  if (bVar1 == 0) goto LAB_00104583;
  if ((byte)(bVar1 - 0x3a) < 0xf6) {
    message = "expected number";
    goto LAB_001046cb;
  }
  iVar4 = iVar4 * 10 + (uint)bVar1 + -0x30;
  *piVar5 = iVar4;
  goto LAB_001045e2;
LAB_00104578:
  lVar9 = lVar9 + 8;
  goto LAB_00104546;
LAB_00104583:
  iVar8 = iVar8 + 1;
  goto LAB_0010450f;
}

Assistant:

args_t(int argc, const char **argv) {
      static const char *switches[] = {
        "f", "-force",
        "d", "-decompress", "-uncompress",
        "v", "-verbose",
        "N", "-no-copy-stat",
        "i", "-in", "-input",
        "o", "-out", "-output"
        "D", "-custom-dictionary",
        "q", "-quality",
        "r", "-repeat",
        "w", "-window",
      };

      for (int i = 1; i != argc; ++i) {
        const char *arg = argv[i];
        if (arg[0] == '-') {
          char short_code = '\0';
          for (auto sw : switches) {
            if (!sw[1]) short_code = sw[0];
            if (sw[0] == arg[1] && !strcmp(sw+1, arg+2)) {
              switch(short_code) {
                case 'f': {
                  force = true;
                } break;
                case 'd': case 'u': {
                  decompress = true;
                } break;
                case 'v': {
                  verbose = true;
                } break;
                case 'N': {
                  if (!sw[1]) { error(arg, "unknown argument", switches); return; }
                  no_copy_stat = true;
                } break;
                case 'i': case 'o': {
                  if (i+1 == argc) { error(arg, "too few arguments", switches); return; }
                  if (short_code == 'D' && !sw[1]) { error(arg, "unknown argument", switches); return; }
                  const char * &rhs = short_code == 'i' ? input_file : 'o' ? output_file : custom_dictionary;
                  rhs = argv[++i];
                } break;
                case 'q': case 'r': case 'w': {
                  if (i+1 == argc) { error(arg, "too few arguments", switches); return; }
                  int &rhs = short_code == 'q' ? quality : short_code == 'r' ? repeat : window;
                  rhs = 0;
                  const char *p = argv[++i];
                  while (*p) {
                    if (*p < '0' || *p > '9') { error(p, "expected number", switches); return; }
                    rhs = rhs * 10 + *p - '0';
                  }
                } break;
                default: {
                  error(arg, "unknown argument", switches); return;
                } break;
              }
              break;
            }
          }
        } else {
          error(arg, "unexpected argument", switches);
          return;
        }
      }

      if (quality > 99) {
        error("", "quality out of range", switches);
      } else if (window < 10 || window >= 25) {
        error("", "window out of range", switches);
      } else {
        fail = false;
      }
    }